

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
TypeArray::TypeArray(TypeArray *this,InplaceStr name,TypeBase *subType,longlong length)

{
  longlong length_local;
  TypeBase *subType_local;
  TypeArray *this_local;
  InplaceStr name_local;
  
  TypeBase::TypeBase(&this->super_TypeBase,0x13,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeArray_002d1c48;
  this->subType = subType;
  this->length = length;
  (this->super_TypeBase).size = subType->size * length;
  (this->super_TypeBase).isGeneric = (bool)(subType->isGeneric & 1);
  (this->super_TypeBase).hasPointers = (bool)(subType->hasPointers & 1);
  return;
}

Assistant:

TypeArray(InplaceStr name, TypeBase *subType, long long length): TypeBase(myTypeID, name), subType(subType), length(length)
	{
		size = subType->size * length;

		isGeneric = subType->isGeneric;

		hasPointers = subType->hasPointers;
	}